

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O0

SpatialTransform * RigidBodyDynamics::jcalc_XJ(Model *model,uint joint_id,VectorNd *q)

{
  reference pvVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  string *text;
  void *this;
  undefined8 uVar4;
  Vector3_t *in_RCX;
  uint in_EDX;
  long in_RSI;
  SpatialTransform *in_RDI;
  ostringstream errormsg;
  SpatialTransform trans;
  SpatialTransform rot;
  Index in_stack_fffffffffffffc08;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_fffffffffffffc10;
  RBDLError *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc48;
  double *v2;
  double *in_stack_fffffffffffffc50;
  Vector3_t *v1;
  double *in_stack_fffffffffffffc58;
  double *v0;
  Vector3_t *in_stack_fffffffffffffc60;
  Vector3d *in_stack_fffffffffffffc68;
  Vector3d *r;
  SpatialTransform *this_00;
  ostringstream local_2e8 [144];
  Vector3d *in_stack_fffffffffffffda8;
  Scalar in_stack_fffffffffffffdb0;
  
  this_00 = in_RDI;
  pvVar1 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RSI + 0xa0),(ulong)in_EDX);
  if ((pvVar1->mDoFCount == 1) &&
     (pvVar1 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RSI + 0xa0),(ulong)in_EDX), pvVar1->mJointType != JointTypeCustom
     )) {
    pvVar1 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RSI + 0xa0),(ulong)in_EDX);
    if (pvVar1->mJointType == JointTypeRevolute) {
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RSI + 0xa0),(ulong)in_EDX);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RSI + 0xa0),(ulong)in_EDX);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RSI + 0xa0),(ulong)in_EDX);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RSI + 0xa0),(ulong)in_EDX);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      Vector3_t::Vector3_t
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      Math::Xrot(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    else {
      pvVar1 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RSI + 0xa0),(ulong)in_EDX);
      if (pvVar1->mJointType == JointTypePrismatic) {
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        Vector3_t::Vector3_t
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   in_stack_fffffffffffffc48);
        Math::Xtrans(in_stack_fffffffffffffc68);
      }
      else {
        pvVar1 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)(in_RSI + 0xa0),(ulong)in_EDX);
        if (pvVar1->mJointType != JointTypeHelical) goto LAB_00834c86;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                            in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        v2 = (double *)*pdVar2;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        Vector3_t::Vector3_t
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,v2)
        ;
        Math::Xrot(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                           (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        v0 = (double *)*pSVar3;
        v1 = in_RCX;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                           (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        r = (Vector3d *)*pSVar3;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(in_RSI + 0xa0),(ulong)in_EDX);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        Vector3_t::Vector3_t(in_RCX,v0,(double *)v1,v2);
        Math::Xtrans(r);
        Math::SpatialTransform::operator*(this_00,in_RDI);
      }
    }
    return this_00;
  }
LAB_00834c86:
  std::__cxx11::ostringstream::ostringstream(local_2e8);
  text = (string *)std::operator<<((ostream *)local_2e8,"Error: invalid joint type: ");
  pvVar1 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RSI + 0xa0),(ulong)in_EDX);
  this = (void *)std::ostream::operator<<(text,pvVar1->mJointType);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  uVar4 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  Errors::RBDLError::RBDLError(in_stack_fffffffffffffc30,text);
  __cxa_throw(uVar4,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI Math::SpatialTransform jcalc_XJ (
    Model &model,
    unsigned int joint_id,
    const Math::VectorNd &q) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom) {
    if (model.mJoints[joint_id].mJointType == JointTypeRevolute) {
      return Xrot (q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
    } else if (model.mJoints[joint_id].mJointType == JointTypePrismatic) {
      return Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
    } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
      SpatialTransform rot = Xrot(
          q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
      SpatialTransform trans = Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
      return rot * trans;
    }
  }

  std::ostringstream errormsg;
  errormsg << "Error: invalid joint type: " << model.mJoints[joint_id].mJointType << std::endl;
  throw Errors::RBDLError(errormsg.str());

  //never reaches this
  return SpatialTransform();
}